

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O1

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_1,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  RhsScalar *pRVar2;
  ulong stride;
  int iVar3;
  LhsScalar *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  double local_198;
  ulong local_190;
  long local_188;
  long local_180;
  long local_178;
  ulong local_170;
  ulong local_168;
  long local_160;
  long local_158;
  RhsScalar *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  long local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  ulong local_108;
  LhsScalar *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  long local_d8;
  double *local_d0;
  long local_c8;
  ulong local_c0;
  double *local_b8;
  long local_b0;
  long local_a8;
  RhsScalar *local_a0;
  ulong local_98;
  RhsScalar *local_90;
  double *local_88;
  long local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  LhsScalar *local_60;
  blas_data_mapper<double,_long,_0,_0> local_58;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  local_41;
  long lStack_40;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  pack_rhs;
  long cols;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  pack_lhs;
  
  pdVar8 = &local_198;
  local_b0 = triStride;
  local_f8 = _tri;
  lStack_40 = otherSize;
  local_68 = size;
  lVar12 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar12 = size;
  }
  uVar20 = lVar12 * blocking->m_kc;
  if (uVar20 >> 0x3d != 0) {
LAB_001183a2:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = time;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_60 = blocking->m_blockA;
  local_c8 = lVar12;
  local_98 = blocking->m_kc;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar20 < 0x4001) {
      pLVar4 = (LhsScalar *)((long)&local_198 - (uVar20 * 8 + 0x1e & 0xfffffffffffffff0));
      local_60 = pLVar4;
      pdVar8 = pLVar4;
    }
    else {
      pLVar4 = (LhsScalar *)malloc(uVar20 * 8);
      if (((ulong)pLVar4 & 0xf) != 0) goto LAB_0011843a;
      local_60 = pLVar4;
      pdVar8 = &local_198;
      if (pLVar4 == (LhsScalar *)0x0) goto LAB_001183a2;
    }
  }
  else {
    pLVar4 = (LhsScalar *)0x0;
    pdVar8 = &local_198;
  }
  lVar12 = lStack_40;
  uVar7 = local_98 * lStack_40;
  local_c0 = uVar7;
  if (0x1fffffffffffffff < uVar7) {
    pdVar8[-1] = 5.67121156629208e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = time;
    pdVar8[-1] = 5.67138942992459e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a0 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar7 < 0x4001) {
      pdVar8 = (double *)((long)pdVar8 - (uVar7 * 8 + 0x1e & 0xfffffffffffffff0));
      local_90 = pdVar8;
      local_a0 = pdVar8;
    }
    else {
      pdVar8[-1] = 5.66236285057507e-318;
      local_90 = (RhsScalar *)malloc(uVar7 * 8);
      if (((ulong)local_90 & 0xf) != 0) {
LAB_0011843a:
        *(undefined8 *)((long)pdVar8 + -8) = 0x118459;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/util/Memory.h"
                      ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_a0 = local_90;
      if (local_90 == (RhsScalar *)0x0) {
        pdVar8[-1] = 5.67188843622689e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = time;
        pdVar8[-1] = (double)&LAB_00118487;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_90 = (RhsScalar *)0x0;
  }
  local_108 = uVar20;
  local_100 = pLVar4;
  if (manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') {
    pdVar8[-1] = 5.67144871780209e-318;
    iVar3 = __cxa_guard_acquire();
    if (iVar3 != 0) {
      pdVar8[-1] = 5.67154753093126e-318;
      CacheSizes::CacheSizes
                ((CacheSizes *)&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes)
      ;
      pdVar8[-1] = 5.67160681880876e-318;
      __cxa_guard_release();
      lVar12 = lStack_40;
    }
  }
  if (lVar12 < 1) {
    pdVar16 = (double *)0x0;
  }
  else {
    uVar20 = local_68;
    if ((long)local_68 < otherStride) {
      uVar20 = otherStride;
    }
    uVar7 = DAT_0013d838 / (uVar20 << 5);
    uVar20 = uVar7 + 3;
    if (-1 < (long)uVar7) {
      uVar20 = uVar7;
    }
    pdVar16 = (double *)(uVar20 & 0xfffffffffffffffc);
  }
  if ((long)pdVar16 < 5) {
    pdVar16 = (double *)0x4;
  }
  if (0 < (long)local_68) {
    local_110 = _other + 1;
    local_160 = local_98 * 8;
    local_180 = otherStride * (long)pdVar16 * 8;
    local_130 = local_f8 + 1;
    local_198 = (double)(local_b0 * 8 + 8);
    local_158 = local_98 * (long)local_198;
    local_188 = local_b0 * 0x20 + 0x20;
    local_128 = local_68 - local_98;
    local_120 = _other + local_98;
    local_178 = local_c8 * 8;
    local_118 = local_f8 + local_98;
    local_70 = 0;
    local_138 = pdVar16;
    uVar20 = local_68;
    uVar7 = local_68;
    do {
      local_168 = uVar7;
      if ((long)local_98 < (long)uVar7) {
        uVar7 = local_98;
      }
      local_170 = uVar7;
      uVar7 = uVar20 - local_70;
      if ((long)local_98 < (long)(uVar20 - local_70)) {
        uVar7 = local_98;
      }
      local_78 = uVar7;
      if (0 < lVar12) {
        local_d0 = local_110;
        lVar10 = 0;
        do {
          local_80 = lVar10;
          local_b8 = (double *)(lVar12 - lVar10);
          pdVar16 = local_b8;
          if ((long)local_138 < (long)local_b8) {
            pdVar16 = local_138;
          }
          local_e0 = pdVar16;
          if (0 < (long)uVar7) {
            local_150 = local_a0 + lVar10 * uVar7;
            local_148 = _other + lVar10 * otherStride;
            local_e8 = local_130;
            local_140 = local_d0;
            lVar12 = 0;
            uVar20 = local_170;
            do {
              stride = local_78;
              pdVar17 = local_e0;
              pRVar2 = local_150;
              local_190 = uVar20;
              uVar5 = 4;
              if ((long)uVar20 < 4) {
                uVar5 = uVar20;
              }
              if ((long)uVar5 < 2) {
                uVar5 = 1;
              }
              local_a8 = lVar12;
              local_f0 = (double *)(uVar7 - lVar12);
              pdVar9 = (double *)0x4;
              if ((long)local_f0 < 4) {
                pdVar9 = local_f0;
              }
              local_88 = pdVar9;
              if (0 < (long)local_f0) {
                uVar20 = 0;
                pdVar11 = local_e8;
                pdVar14 = local_140;
                do {
                  if (0 < (long)local_b8) {
                    lVar15 = local_70 + lVar12 + uVar20;
                    dVar1 = local_f8[lVar15 * local_b0 + lVar15];
                    pdVar18 = pdVar14;
                    lVar19 = local_80;
                    do {
                      dVar21 = _other[lVar19 * otherStride + lVar15] * (1.0 / dVar1);
                      _other[lVar19 * otherStride + lVar15] = dVar21;
                      if (0 < (long)(~uVar20 + (long)pdVar9)) {
                        lVar13 = 0;
                        do {
                          pdVar18[lVar13] = pdVar11[lVar13] * -dVar21 + pdVar18[lVar13];
                          lVar13 = lVar13 + 1;
                        } while (lVar13 < (long)(~uVar20 + (long)pdVar9));
                      }
                      lVar19 = lVar19 + 1;
                      pdVar18 = pdVar18 + otherStride;
                    } while (lVar19 < (long)pdVar16 + lVar10);
                  }
                  uVar20 = uVar20 + 1;
                  pdVar14 = pdVar14 + 1;
                  pdVar11 = (double *)((long)pdVar11 + (long)local_198);
                } while (uVar20 != uVar5);
              }
              local_d8 = lVar12 + local_70;
              local_58.m_data = local_148 + lVar12 + local_70;
              local_58.m_stride = otherStride;
              pdVar8[-2] = (double)lVar12;
              pdVar8[-3] = 5.66692307648618e-318;
              gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
              ::operator()(&local_41,pRVar2,&local_58,(long)pdVar9,(long)pdVar17,stride,
                           (long)pdVar8[-2]);
              pLVar4 = local_60;
              pdVar17 = (double *)((long)local_f0 - (long)pdVar9);
              if (0 < (long)pdVar17) {
                lVar12 = (long)pdVar9 + local_d8;
                lVar15 = local_d8 * local_b0;
                local_d8 = lVar12;
                local_58.m_data = local_f8 + lVar15 + lVar12;
                local_58.m_stride = local_b0;
                local_f0 = pdVar17;
                pdVar8[-2] = 0.0;
                pdVar8[-3] = 5.66748631132244e-318;
                gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                              *)((long)&cols + 7),pLVar4,
                             (const_blas_data_mapper<double,_long,_0> *)&local_58,(long)pdVar9,
                             (long)pdVar17,0,(long)pdVar8[-2]);
                pLVar4 = local_60;
                pdVar9 = local_88;
                pdVar17 = local_f0;
                pRVar2 = local_150;
                local_58.m_data = local_148 + local_d8;
                local_58.m_stride = otherStride;
                pdVar8[-2] = (double)local_a8;
                pdVar8[-3] = 0.0;
                pdVar8[-4] = (double)local_78;
                pdVar8[-5] = (double)pdVar9;
                pdVar8[-6] = (double)local_e0;
                pdVar8[-7] = 5.66795567368599e-318;
                gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                              *)((long)&cols + 6),&local_58,pLVar4,pRVar2,(long)pdVar17,(long)pdVar9
                             ,(long)pdVar8[-6],-1.0,(long)pdVar8[-5],(long)pdVar8[-4],
                             (long)pdVar8[-3],(long)pdVar8[-2]);
              }
              lVar12 = local_a8 + 4;
              uVar20 = local_190 - 4;
              local_140 = local_140 + 4;
              local_e8 = (double *)((long)local_e8 + local_188);
              uVar7 = local_78;
            } while (lVar12 < (long)local_78);
          }
          lVar10 = local_80 + (long)local_138;
          local_d0 = (double *)((long)local_d0 + local_180);
          lVar12 = lStack_40;
        } while (lVar10 < lStack_40);
      }
      lVar10 = local_70 + local_98;
      local_70 = lVar10;
      uVar20 = local_68;
      pdVar16 = local_118;
      pdVar17 = local_120;
      lVar12 = local_128;
      if (lVar10 < (long)local_68) {
        do {
          pLVar4 = local_60;
          lVar19 = lVar12 - local_c8;
          lVar15 = lVar12;
          if (local_c8 <= lVar12) {
            lVar15 = local_c8;
          }
          lVar12 = lVar19;
          if (0 < lVar15) {
            local_80 = lVar19;
            local_b8 = pdVar17;
            local_88 = pdVar16;
            local_58.m_data = pdVar16;
            local_58.m_stride = local_b0;
            pdVar8[-2] = 0.0;
            pdVar8[-3] = 5.66929953224268e-318;
            gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
            ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                          *)((long)&cols + 7),pLVar4,
                         (const_blas_data_mapper<double,_long,_0> *)&local_58,uVar7,lVar15,0,
                         (long)pdVar8[-2]);
            local_58.m_data = local_b8;
            local_58.m_stride = otherStride;
            pdVar8[-3] = 0.0;
            pdVar8[-2] = 0.0;
            pdVar8[-4] = -NAN;
            pdVar8[-5] = -NAN;
            pdVar8[-6] = (double)lStack_40;
            pLVar4 = local_60;
            uVar20 = local_78;
            pRVar2 = local_a0;
            pdVar8[-7] = 5.66977877591914e-318;
            gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
            ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                          *)((long)&cols + 6),&local_58,pLVar4,pRVar2,lVar15,uVar20,(long)pdVar8[-6]
                         ,-1.0,(long)pdVar8[-5],(long)pdVar8[-4],(long)pdVar8[-3],(long)pdVar8[-2]);
            uVar20 = local_68;
            pdVar16 = local_88;
            pdVar17 = local_b8;
            uVar7 = local_78;
            lVar12 = local_80;
          }
          lVar10 = lVar10 + local_c8;
          pdVar17 = (double *)((long)pdVar17 + local_178);
          pdVar16 = (double *)((long)pdVar16 + local_178);
        } while (lVar10 < (long)uVar20);
      }
      uVar7 = local_168 - local_98;
      local_110 = (double *)((long)local_110 + local_160);
      local_130 = (double *)((long)local_130 + local_158);
      local_128 = local_128 - local_98;
      local_120 = (double *)((long)local_120 + local_160);
      local_118 = (double *)((long)local_118 + local_158);
      lVar12 = lStack_40;
    } while (local_70 < (long)uVar20);
  }
  pRVar2 = local_90;
  if (0x4000 < local_c0) {
    pdVar8[-1] = 5.67073726327208e-318;
    free(pRVar2);
  }
  pLVar4 = local_100;
  if (0x4000 < local_108) {
    pdVar8[-1] = 5.67086077968354e-318;
    free(pLVar4);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }